

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O3

int ON_StringLengthUTF16(ON__UINT16 *string,size_t string_capacity)

{
  ON__UINT16 *pOVar1;
  ON__UINT16 *string1;
  
  pOVar1 = string;
  if ((string_capacity != 0 && string != (ON__UINT16 *)0x0) && (0 < (long)string_capacity)) {
    do {
      if (*pOVar1 == 0) break;
      pOVar1 = pOVar1 + 1;
    } while (pOVar1 < string + string_capacity);
  }
  return (int)((ulong)((long)pOVar1 - (long)string) >> 1);
}

Assistant:

int ON_StringLengthUTF16(
  const ON__UINT16* string,
  size_t string_capacity
  )
{
  const ON__UINT16* string1 = string;
  if (nullptr != string1 && string_capacity > 0 )
  {
    for (const ON__UINT16* end = string1 + string_capacity; string1 < end; string1++)
    {
      if ( 0 == *string1)
        break;
    }
  }
  return (int)(string1 - string);
}